

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O2

Statement *
slang::ast::RandSequenceStatement::fromSyntax
          (Compilation *comp,RandSequenceStatementSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  int iVar1;
  RandSeqProductionSymbol *prod;
  RandSeqProductionSymbol *pRVar2;
  SourceLocation SVar3;
  undefined4 extraout_var;
  RandSequenceStatement *pRVar4;
  specific_symbol_iterator<slang::ast::RandSeqProductionSymbol> extraout_RDX;
  SourceLocation extraout_RDX_00;
  specific_symbol_iterator<slang::ast::RandSeqProductionSymbol> extraout_RDX_01;
  EVP_PKEY_CTX *pEVar6;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_(std::ranges::subrange_kind)0>
  sVar7;
  SourceRange SVar8;
  string_view name;
  RandSeqProductionSymbol *firstProd;
  specific_symbol_iterator<slang::ast::RandSeqProductionSymbol> __begin2;
  SmallVector<const_slang::ast::RandSeqProductionSymbol_*,_5UL> productions;
  RandSeqProductionSymbol *local_e0;
  Compilation *local_d8;
  SourceRange local_d0;
  SourceRange local_c0;
  undefined1 local_b0 [64];
  SmallVectorBase<const_slang::ast::RandSeqProductionSymbol_*> local_70 [2];
  specific_symbol_iterator<slang::ast::RandSeqProductionSymbol> sVar5;
  
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  local_d8 = comp;
  sVar7 = Scope::membersOfType<slang::ast::RandSeqProductionSymbol>((context->scope).ptr);
  sVar5 = sVar7._M_end.current;
  while (local_b0._0_8_ = sVar7._M_begin.current, (Symbol *)local_b0._0_8_ != sVar5.current) {
    local_d0.startLoc = (SourceLocation)local_b0._0_8_;
    SmallVectorBase<slang::ast::RandSeqProductionSymbol_const*>::
    emplace_back<slang::ast::RandSeqProductionSymbol_const*>
              ((SmallVectorBase<slang::ast::RandSeqProductionSymbol_const*> *)local_70,
               (RandSeqProductionSymbol **)&local_d0);
    Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>::increment
              ((specific_symbol_iterator<slang::ast::RandSeqProductionSymbol> *)local_b0);
    sVar7._M_end.current = extraout_RDX.current;
    sVar7._M_begin.current = (Symbol *)local_b0._0_8_;
  }
  local_e0 = (RandSeqProductionSymbol *)0x0;
  if ((syntax->firstProduction).info == (Info *)0x0) {
    if (local_70[0].len == 0) goto LAB_003e0ff2;
    pRVar2 = *local_70[0].data_;
    local_e0 = pRVar2;
    SVar3 = parsing::Token::location(&syntax->randsequence);
    SVar8 = parsing::Token::range(&syntax->closeParen);
    sVar5.current = (Symbol *)SVar8.endLoc;
    SVar8.endLoc = (SourceLocation)sVar5.current;
    SVar8.startLoc = SVar3;
  }
  else {
    SVar8 = parsing::Token::range(&syntax->firstProduction);
    name = parsing::Token::valueText(&syntax->firstProduction);
    pRVar2 = RandSeqProductionSymbol::findProduction(name,SVar8,context);
    sVar5.current = (Symbol *)extraout_RDX_00;
    local_e0 = pRVar2;
  }
  sVar7._M_end.current = sVar5.current;
  sVar7._M_begin.current = (Symbol *)local_b0._0_8_;
  if (pRVar2 != (RandSeqProductionSymbol *)0x0) {
    local_b0._0_8_ = local_b0 + 0x18;
    local_b0._8_8_ = 0;
    local_b0._16_8_ = 5;
    pEVar6 = (EVP_PKEY_CTX *)(pRVar2->arguments)._M_ptr;
    local_c0 = SVar8;
    CallExpression::bindArgs
              ((ArgumentListSyntax *)0x0,pRVar2->arguments,(pRVar2->super_Symbol).name,SVar8,context
               ,(SmallVectorBase<const_slang::ast::Expression_*> *)local_b0,false);
    SmallVectorBase<const_slang::ast::Expression_*>::cleanup
              ((SmallVectorBase<const_slang::ast::Expression_*> *)local_b0,pEVar6);
    sVar7._M_end.current = extraout_RDX_01.current;
    sVar7._M_begin.current = (Symbol *)local_b0._0_8_;
  }
LAB_003e0ff2:
  this = local_d8;
  local_b0._0_8_ = sVar7._M_begin.current;
  iVar1 = SmallVectorBase<const_slang::ast::RandSeqProductionSymbol_*>::copy
                    (local_70,(EVP_PKEY_CTX *)local_d8,(EVP_PKEY_CTX *)sVar7._M_end.current.current)
  ;
  local_b0._0_8_ = CONCAT44(extraout_var,iVar1);
  local_d0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  pEVar6 = (EVP_PKEY_CTX *)&local_e0;
  pRVar4 = BumpAllocator::
           emplace<slang::ast::RandSequenceStatement,slang::ast::RandSeqProductionSymbol_const*&,std::span<slang::ast::RandSeqProductionSymbol_const*,18446744073709551615ul>,slang::SourceRange>
                     (&this->super_BumpAllocator,(RandSeqProductionSymbol **)pEVar6,
                      (span<const_slang::ast::RandSeqProductionSymbol_*,_18446744073709551615UL> *)
                      local_b0,&local_d0);
  SmallVectorBase<const_slang::ast::RandSeqProductionSymbol_*>::cleanup(local_70,pEVar6);
  return &pRVar4->super_Statement;
}

Assistant:

Statement& RandSequenceStatement::fromSyntax(Compilation& comp,
                                             const RandSequenceStatementSyntax& syntax,
                                             const ASTContext& context) {
    SmallVector<const RandSeqProductionSymbol*> productions;
    for (auto& prod : context.scope->membersOfType<RandSeqProductionSymbol>())
        productions.push_back(&prod);

    SourceRange firstProdRange;
    const RandSeqProductionSymbol* firstProd = nullptr;
    if (syntax.firstProduction) {
        firstProdRange = syntax.firstProduction.range();
        firstProd = RandSeqProductionSymbol::findProduction(syntax.firstProduction.valueText(),
                                                            firstProdRange, context);
    }
    else if (!productions.empty()) {
        firstProd = productions[0];
        firstProdRange = {syntax.randsequence.location(), syntax.closeParen.range().end()};
    }

    if (firstProd) {
        // Make sure the first production doesn't require arguments.
        SmallVector<const Expression*> args;
        CallExpression::bindArgs(nullptr, firstProd->arguments, firstProd->name, firstProdRange,
                                 context, args, /* isBuiltInMethod */ false);
    }

    // All of the logic for creating productions is in the RandSeqProduction symbol.
    return *comp.emplace<RandSequenceStatement>(firstProd, productions.copy(comp),
                                                syntax.sourceRange());
}